

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                  *this,char *begin,char *end)

{
  iterator it;
  type tVar1;
  char *in_RDX;
  long in_RDI;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  f;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  undefined4 in_stack_ffffffffffffff10;
  type in_stack_ffffffffffffff14;
  basic_format_specs<char> *in_stack_ffffffffffffff18;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffff20;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
  *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff60;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff68;
  undefined8 local_90;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff78;
  arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff80;
  context_type *in_stack_ffffffffffffff88;
  arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff90;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  local_30;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *local_28;
  char *local_20;
  iterator local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  local_28 = internal::
             context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
             ::parse_context((context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                              *)(in_RDI + 8));
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (in_stack_ffffffffffffff20,(iterator)in_stack_ffffffffffffff18);
  internal::
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  ::custom_formatter(&local_30,
                     (basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
                      *)(in_RDI + 8));
  tVar1 = visit_format_arg<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>&,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (tVar1) {
    local_8 = basic_parse_context<char,_fmt::v5::internal::error_handler>::begin
                        ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)0x2a1211);
  }
  else {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    internal::
    specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
    ::specs_handler((specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                     *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                    (basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>
                     *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
    ::type((basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            *)(in_RDI + 0x70));
    internal::
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
    ::specs_checker((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>_>
                     *)in_stack_ffffffffffffff20,
                    (specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                     *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    local_18 = internal::
               parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>>&>
                         (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          in_stack_ffffffffffffff38);
    if ((local_18 == local_20) || (*local_18 != '}')) {
      internal::error_handler::on_error
                ((error_handler *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
              (in_stack_ffffffffffffff20,(iterator)in_stack_ffffffffffffff18);
    arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
    ::arg_formatter(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    (format_specs *)in_stack_ffffffffffffff80);
    visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    it.super_truncating_iterator_base<char_*>.limit_._0_4_ = (int)in_stack_ffffffffffffff78;
    it.super_truncating_iterator_base<char_*>.out_ = (char *)local_90;
    it.super_truncating_iterator_base<char_*>.limit_._4_4_ =
         (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    it.super_truncating_iterator_base<char_*>.count_ = (size_t)in_stack_ffffffffffffff80;
    it._24_8_ = in_stack_ffffffffffffff88;
    internal::
    context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
    ::advance_to((context_base<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>,_char>
                  *)(in_RDI + 8),it);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }